

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString BracketsFormattedHexStringFrom(cpputest_longlong value)

{
  size_t extraout_RDX;
  SimpleString SVar1;
  SimpleString local_28;
  cpputest_longlong value_local;
  
  value_local = value;
  HexStringFrom((cpputest_longlong)&local_28);
  BracketsFormattedHexString((SimpleString *)value);
  SimpleString::~SimpleString(&local_28);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)value;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(cpputest_longlong value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}